

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

void Acb_ObjPushToFanin(Acb_Ntk_t *p,int iObj,int iFaninIndex2,int iFanin)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  word *pwVar15;
  char *pcVar16;
  ulong uVar17;
  word wVar18;
  int iVar19;
  ulong uVar20;
  word wVar21;
  word uTruthObjNew;
  word local_40;
  ulong local_38;
  
  local_40 = 0;
  if (0 < iObj) {
    iVar19 = (p->vObjTruth).nSize;
    if (iVar19 < 1) {
      pcVar16 = "Acb_NtkHasObjTruths(p)";
      goto LAB_003a8b15;
    }
    if (iVar19 <= iObj) {
LAB_003a8ab1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                    ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
    if (0 < iFanin) {
      if (iFanin < iVar19) {
        if ((p->vObjFans).nSize <= iObj) {
LAB_003a8a89:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar19 = (p->vObjFans).pArray[(uint)iObj];
        if ((-1 < (long)iVar19) && (iVar19 < (p->vFanSto).nSize)) {
          pwVar15 = (p->vObjTruth).pArray;
          local_38 = pwVar15[(uint)iFanin];
          puVar2 = (uint *)((p->vFanSto).pArray + iVar19);
          uVar3 = *puVar2;
          uVar17 = 0;
          uVar20 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar20 = uVar17;
          }
          do {
            if (uVar20 == uVar17) {
              iVar19 = -1;
              goto LAB_003a87b5;
            }
            uVar1 = uVar17 + 1;
            lVar13 = uVar17 + 1;
            uVar17 = uVar1;
          } while (puVar2[lVar13] != iFanin);
          iVar19 = (int)uVar1 + -1;
LAB_003a87b5:
          iVar11 = Abc_TtCheckDsdAnd(pwVar15[(uint)iObj],iVar19,iFaninIndex2,&local_40);
          iVar4 = (p->vObjFans).nSize;
          if (iVar4 <= iObj) goto LAB_003a8a89;
          piVar8 = (p->vObjFans).pArray;
          iVar5 = piVar8[(uint)iObj];
          if ((-1 < (long)iVar5) && (iVar6 = (p->vFanSto).nSize, iVar5 < iVar6)) {
            if (iVar4 <= iFanin) goto LAB_003a8a89;
            iVar4 = piVar8[(uint)iFanin];
            if ((-1 < (long)iVar4) && (iVar4 < iVar6)) {
              piVar9 = (p->vFanSto).pArray;
              piVar8 = piVar9 + iVar5;
              lVar13 = (long)iFaninIndex2;
              uVar3 = piVar8[lVar13 + 1];
              puVar2 = (uint *)(piVar9 + iVar4);
              uVar7 = *puVar2;
              uVar17 = 0;
              uVar20 = 0;
              if (0 < (int)uVar7) {
                uVar17 = (ulong)uVar7;
              }
              do {
                if (uVar17 == uVar20) {
                  uVar14 = 0xffffffff;
                  goto LAB_003a886a;
                }
                uVar1 = uVar20 + 1;
                lVar10 = uVar20 + 1;
                uVar20 = uVar1;
              } while (puVar2[lVar10] != uVar3);
              uVar14 = (int)uVar1 - 1;
LAB_003a886a:
              if (uVar14 != 0xffffffff) {
                uVar7 = uVar14;
              }
              iVar4 = (p->vObjType).nSize;
              if (iObj < iVar4) {
                pcVar16 = (p->vObjType).pArray;
                if (0xfd < (byte)(pcVar16[(uint)iObj] - 5U)) {
                  __assert_fail("!Acb_ObjIsCio(p, iObj)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                                ,0x69,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
                }
                if (iFanin < iVar4) {
                  if (0xfd < (byte)(pcVar16[(uint)iFanin] - 5U)) {
                    __assert_fail("!Acb_ObjIsCio(p, iFanin)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                                  ,0x6a,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
                  }
                  iVar4 = *piVar8;
                  if (iVar4 <= iVar19) {
                    __assert_fail("iFaninIndex < Acb_ObjFaninNum(p, iObj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                                  ,0x6b,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
                  }
                  if (iVar4 <= iFaninIndex2) {
                    __assert_fail("iFaninIndex2 < Acb_ObjFaninNum(p, iObj)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                                  ,0x6c,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
                  }
                  if (iVar19 == iFaninIndex2) {
                    __assert_fail("iFaninIndex != iFaninIndex2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                                  ,0x6d,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
                  }
                  if ((p->vFanouts).nSize <= iFanin) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
                  }
                  if ((p->vFanouts).pArray[(uint)iFanin].nSize != 1) {
                    __assert_fail("Acb_ObjFanoutNum(p, iFanin) == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                                  ,0x6e,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
                  }
                  uVar20 = local_38;
                  switch(iVar11) {
                  case 1:
                    uVar20 = ~local_38;
                  case 0:
                    wVar21 = uVar20 & s_Truths6[(int)uVar7];
                    break;
                  case 2:
                    wVar21 = local_38 & ~s_Truths6[(int)uVar7];
                    break;
                  case 3:
                    wVar21 = ~(local_38 | s_Truths6[(int)uVar7]);
                    break;
                  case 4:
                    wVar21 = local_38 ^ s_Truths6[(int)uVar7];
                    break;
                  default:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                                  ,0x7a,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
                  }
                  if ((s_Truths6Neg[lVar13] &
                      (local_40 >> ((byte)(1 << ((byte)iFaninIndex2 & 0x1f)) & 0x3f) ^ local_40)) !=
                      0) {
                    __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                  ,0x6cb,"word Abc_Tt6RemoveVar(word, int)");
                  }
                  wVar18 = local_40;
                  if (iFaninIndex2 < 5) {
                    pwVar15 = s_PMasks[lVar13] + 2;
                    do {
                      lVar13 = lVar13 + 1;
                      bVar12 = (byte)(1 << ((byte)iFaninIndex2 & 0x1f));
                      wVar18 = (wVar18 & *pwVar15) >> (bVar12 & 0x3f) |
                               (pwVar15[-1] & wVar18) << (bVar12 & 0x3f) |
                               (*(word (*) [3])(pwVar15 + -2))[0] & wVar18;
                      iFaninIndex2 = iFaninIndex2 + 1;
                      pwVar15 = pwVar15 + 3;
                    } while ((int)lVar13 != 5);
                  }
                  iVar19 = (p->vObjTruth).nSize;
                  if (iObj < iVar19) {
                    pwVar15 = (p->vObjTruth).pArray;
                    pwVar15[(uint)iObj] = wVar18;
                    if (iFanin < iVar19) {
                      pwVar15[(uint)iFanin] = wVar21;
                      Acb_ObjRemoveFaninFanoutOne(p,iObj,uVar3);
                      if ((p->vObjFans).nSize <= iFanin) goto LAB_003a8a89;
                      iVar19 = (p->vObjFans).pArray[(uint)iFanin];
                      if ((-1 < (long)iVar19) && (iVar19 < (p->vFanSto).nSize)) {
                        if (uVar7 == (p->vFanSto).pArray[iVar19]) {
                          Acb_ObjAddFaninFanoutOne(p,iFanin,uVar3);
                        }
                        return;
                      }
                      goto LAB_003a8a6a;
                    }
                  }
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
                }
              }
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
          }
        }
LAB_003a8a6a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      goto LAB_003a8ab1;
    }
  }
  pcVar16 = "i>0";
LAB_003a8b15:
  __assert_fail(pcVar16,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_ObjPushToFanin( Acb_Ntk_t * p, int iObj, int iFaninIndex2, int iFanin )
{
    word uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj );
    word uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanin );
    int iFaninIndex = Acb_ObjWhatFanin( p, iObj, iFanin );
    int DecType = Abc_TtCheckDsdAnd( uTruthObj, iFaninIndex, iFaninIndex2, &uTruthObjNew );
    int iFanin2 = Acb_ObjFanin( p, iObj, iFaninIndex2 );
    int iFaninFaninIndex = Acb_ObjWhatFanin( p, iFanin, iFanin2 );
    if ( iFaninFaninIndex == -1 )
        iFaninFaninIndex = Acb_ObjFaninNum(p, iFanin); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanin) );
    assert( iFaninIndex  < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex2 < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex != iFaninIndex2 );
    assert( Acb_ObjFanoutNum(p, iFanin) == 1 );
    // compute new function of the fanout
    if ( DecType == 0 )      //  i *  j
        uTruthFanNew =  uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 1 ) //  i * !j
        uTruthFanNew = ~uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 2 ) // !i *  j
        uTruthFanNew =  uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 3 ) // !i * !j
        uTruthFanNew = ~uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 4 ) //  i #  j
        uTruthFanNew =  uTruthFan ^  s_Truths6[iFaninFaninIndex];
    else assert( 0 );
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex2) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanin, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin2 );
    if ( iFaninFaninIndex == Acb_ObjFaninNum(p, iFanin) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanin, iFanin2 );
}